

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall
mjs::object::define_accessor_property
          (object *this,string *name,object_ptr *accessor,property_attribute attr)

{
  undefined4 uVar1;
  bool bVar2;
  uint uVar3;
  void *pvVar4;
  undefined8 *puVar5;
  uint *puVar6;
  property *ppVar7;
  gc_vector<mjs::object::property> *this_00;
  property_attribute pVar8;
  pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*> pVar9;
  wstring_view key;
  property_attribute local_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_90;
  undefined1 local_70 [40];
  pointer local_48;
  wchar_t *local_40;
  undefined8 local_38;
  wchar_t *local_30;
  
  local_ac = attr;
  if (invalid < attr) {
LAB_0014b532:
    __assert_fail("static_cast<unsigned>(a) <= static_cast<unsigned>(property_attribute::invalid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/property_attribute.h"
                  ,0x24,"bool mjs::is_valid(property_attribute)");
  }
  if (attr == invalid) {
    __assert_fail("is_valid(attr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object.cpp"
                  ,0x2f,
                  "void mjs::object::define_accessor_property(const string &, const object_ptr &, property_attribute)"
                 );
  }
  if ((accessor->super_gc_heap_ptr_untyped).heap_ != (gc_heap *)0x0) {
    pvVar4 = gc_heap_ptr_untyped::get(&accessor->super_gc_heap_ptr_untyped);
    if (*(int *)((long)pvVar4 + 0x14) == 0) {
      local_a8._0_8_ = (gc_heap *)0x0;
      local_a8._8_8_ = local_a8._8_8_ & 0xffffffff00000000;
    }
    else {
      gc_heap::unsafe_create_from_position<mjs::object>
                ((gc_heap *)local_a8,(uint32_t)*(undefined8 *)((long)pvVar4 + 8));
    }
    if ((gc_heap *)local_a8._0_8_ == (gc_heap *)0x0) {
      puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&accessor->super_gc_heap_ptr_untyped);
      local_38 = 3;
      local_30 = L"get";
      (**(code **)*puVar5)(local_98,puVar5);
      if (local_98._0_4_ == object) {
        bVar2 = gc_heap_ptr_untyped::has_type<mjs::function_object>
                          ((gc_heap_ptr_untyped *)&local_90.s_);
      }
      else {
        bVar2 = false;
      }
      if (bVar2 == false) {
        puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&accessor->super_gc_heap_ptr_untyped);
        local_48 = (pointer)0x3;
        local_40 = L"set";
        (**(code **)*puVar5)(local_70,puVar5);
        if ((local_70._0_4_ != object) ||
           (bVar2 = gc_heap_ptr_untyped::has_type<mjs::function_object>
                              ((gc_heap_ptr_untyped *)(local_70 + 8)), !bVar2)) goto LAB_0014b513;
        value::destroy((value *)local_70);
      }
      value::destroy((value *)local_98);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_a8);
      local_ac = local_ac | accessor;
      puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&accessor->super_gc_heap_ptr_untyped);
      local_a8._0_8_ = (gc_heap *)0x3;
      local_a8._8_8_ = L"set";
      (**(code **)*puVar5)((value *)local_98,puVar5,local_a8);
      uVar1 = local_98._0_4_;
      value::destroy((value *)local_98);
      pVar8 = local_ac & (accessor|dont_delete|dont_enum);
      local_ac = local_ac | read_only;
      if (uVar1 != undefined) {
        local_ac = pVar8;
      }
      puVar6 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)name);
      key._M_len = (ulong)*puVar6;
      key._M_str = (wchar_t *)(puVar6 + 1);
      pVar9 = find(this,key);
      ppVar7 = pVar9.first;
      if (ppVar7 != (property *)0x0) {
        local_98._0_4_ = 5;
        local_90.n_ = (double)(accessor->super_gc_heap_ptr_untyped).heap_;
        local_90.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ =
             (accessor->super_gc_heap_ptr_untyped).pos_;
        if (local_90.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ !=
            (gc_heap *)0x0) {
          gc_heap::attach(local_90.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
                          heap_,(gc_heap_ptr_untyped *)&local_90.s_);
        }
        value_representation::value_representation
                  ((value_representation *)local_a8,(value *)local_98);
        (ppVar7->value_).repr_ = local_a8._0_8_;
        value::destroy((value *)local_98);
        ppVar7->attributes_ = local_ac;
        if (ppVar7 != (property *)0x0) {
          return;
        }
      }
      puVar6 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)name);
      local_98 = (undefined1  [8])(ulong)*puVar6;
      local_90.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
           (gc_heap *)(puVar6 + 1);
      uVar3 = (*this->_vptr_object[6])(this);
      if (uVar3 < 0x11) {
        if (uVar3 == 0x10) {
          this_00 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>,_true>::dereference
                              (&this->properties_,this->heap_);
          local_98._0_4_ = 5;
          local_90.n_ = (double)(accessor->super_gc_heap_ptr_untyped).heap_;
          local_90.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ =
               (accessor->super_gc_heap_ptr_untyped).pos_;
          if (local_90.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ !=
              (gc_heap *)0x0) {
            gc_heap::attach(local_90.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
                            heap_,(gc_heap_ptr_untyped *)&local_90.s_);
          }
          gc_vector<mjs::object::property>::
          emplace_back<mjs::string_const&,mjs::value,mjs::property_attribute&>
                    (this_00,name,(value *)local_98,&local_ac);
          value::destroy((value *)local_98);
          return;
        }
        __assert_fail("!is_valid(own_property_attributes(name.view()))",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object.cpp"
                      ,0x3c,
                      "void mjs::object::define_accessor_property(const string &, const object_ptr &, property_attribute)"
                     );
      }
      goto LAB_0014b532;
    }
  }
LAB_0014b513:
  __assert_fail("accessor && !accessor->prototype() && (is_function(accessor->get(L\"get\")) || is_function(accessor->get(L\"set\")))"
                ,"/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object.cpp",
                0x30,
                "void mjs::object::define_accessor_property(const string &, const object_ptr &, property_attribute)"
               );
}

Assistant:

void object::define_accessor_property(const string& name, const object_ptr& accessor, property_attribute attr) {
    assert(is_valid(attr));
    assert(accessor && !accessor->prototype() && (is_function(accessor->get(L"get")) || is_function(accessor->get(L"set"))));
    attr |= property_attribute::accessor;
    if (accessor->get(L"set").type() != value_type::undefined) {
        attr &= ~property_attribute::read_only;
    } else {
        attr |= property_attribute::read_only;
    }
    if (auto it = find(name.view()).first) {
        it->raw_put(value{accessor});
        it->attributes(attr);
        return;
    }
    assert(!is_valid(own_property_attributes(name.view())));
    properties_.dereference(heap()).emplace_back(name, value{accessor}, attr);
}